

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O1

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Fc fc)

{
  char *pcVar1;
  UInt u;
  
  switch((uint)fc.raw >> 3 & 3) {
  case 0:
    if (fc.raw == 1) {
      operator<<(this);
      return this;
    }
    if (fc.raw == 0) {
      operator<<(this);
      return this;
    }
  case 3:
    u.raw = fc.raw & 0xf;
    break;
  case 1:
    operator<<(this,(Dn)(fc.raw & 7));
    return this;
  case 2:
    u.raw = fc.raw & 7;
  }
  pcVar1 = this->ptr;
  this->ptr = pcVar1 + 1;
  *pcVar1 = '#';
  operator<<(this,u);
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Fc fc)
{
    // 10XXX — Function code is specified as bits XXX
    // 01DDD — Function code is specified as bits 2–0 of data register DDD
    // 00000 — Function code is specified as source function code register
    // 00001 — Function code is specified as destination function code register

    switch (fc.raw >> 3 & 0b11) {

        case 0b10:  *this << Imu(fc.raw & 0b111); break;
        case 0b01:  *this << Dn(fc.raw & 0b111); break;

        case 0b00:

            if (fc.raw == 0) { *this << Sfc(); break; }
            if (fc.raw == 1) { *this << Dfc(); break; }
            [[fallthrough]];

        default:    *this << Imu(fc.raw & 0b1111);
    }

    return *this;
}